

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O0

void bench_ecmult_teardown_helper
               (bench_data *data,size_t *seckey_offset,size_t *scalar_offset,
               size_t *scalar_gen_offset,int iters)

{
  int iVar1;
  long in_RCX;
  long in_RSI;
  int in_R8D;
  secp256k1_scalar s;
  secp256k1_scalar sum_scalars;
  secp256k1_gej tmp;
  secp256k1_gej sum_output;
  int i;
  secp256k1_scalar *in_stack_fffffffffffffec0;
  secp256k1_scalar *in_stack_fffffffffffffec8;
  secp256k1_scalar *in_stack_fffffffffffffed0;
  secp256k1_scalar *in_stack_fffffffffffffed8;
  secp256k1_scalar *in_stack_fffffffffffffee0;
  secp256k1_gej *in_stack_ffffffffffffff18;
  secp256k1_gej *in_stack_ffffffffffffff20;
  secp256k1_scalar *in_stack_ffffffffffffff70;
  secp256k1_gej *in_stack_ffffffffffffff78;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffff80;
  int local_28;
  
  secp256k1_gej_set_infinity((secp256k1_gej *)0x11dd6c);
  secp256k1_scalar_clear((secp256k1_scalar *)&stack0xfffffffffffffeb8);
  for (local_28 = 0; local_28 < in_R8D; local_28 = local_28 + 1) {
    secp256k1_gej_add_var
              ((secp256k1_gej *)tmp.x.n[4],(secp256k1_gej *)tmp.x.n[3],(secp256k1_gej *)tmp.x.n[2],
               (secp256k1_fe *)tmp.x.n[1]);
    if (in_RCX != 0) {
      secp256k1_scalar_add
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    }
    if (in_RSI != 0) {
      secp256k1_scalar_mul
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      secp256k1_scalar_add
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    }
  }
  secp256k1_ecmult_gen
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  iVar1 = secp256k1_gej_eq_var(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/bench_ecmult.c"
            ,0x57,"test condition failed: secp256k1_gej_eq_var(&tmp, &sum_output)");
    abort();
  }
  return;
}

Assistant:

static void bench_ecmult_teardown_helper(bench_data* data, size_t* seckey_offset, size_t* scalar_offset, size_t* scalar_gen_offset, int iters) {
    int i;
    secp256k1_gej sum_output, tmp;
    secp256k1_scalar sum_scalars;

    secp256k1_gej_set_infinity(&sum_output);
    secp256k1_scalar_clear(&sum_scalars);
    for (i = 0; i < iters; ++i) {
        secp256k1_gej_add_var(&sum_output, &sum_output, &data->output[i], NULL);
        if (scalar_gen_offset != NULL) {
            secp256k1_scalar_add(&sum_scalars, &sum_scalars, &data->scalars[(*scalar_gen_offset+i) % POINTS]);
        }
        if (seckey_offset != NULL) {
            secp256k1_scalar s = data->seckeys[(*seckey_offset+i) % POINTS];
            secp256k1_scalar_mul(&s, &s, &data->scalars[(*scalar_offset+i) % POINTS]);
            secp256k1_scalar_add(&sum_scalars, &sum_scalars, &s);
        }
    }
    secp256k1_ecmult_gen(&data->ctx->ecmult_gen_ctx, &tmp, &sum_scalars);
    CHECK(secp256k1_gej_eq_var(&tmp, &sum_output));
}